

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::DefaultGlobalTestPartResultReporter::ReportTestPartResult
          (DefaultGlobalTestPartResultReporter *this,TestPartResult *result)

{
  TestResult *this_00;
  TestEventListeners *this_01;
  TestEventListener *pTVar1;
  TestPartResult *result_local;
  DefaultGlobalTestPartResultReporter *this_local;
  
  this_00 = UnitTestImpl::current_test_result(this->unit_test_);
  TestResult::AddTestPartResult(this_00,result);
  this_01 = UnitTestImpl::listeners(this->unit_test_);
  pTVar1 = TestEventListeners::repeater(this_01);
  (*pTVar1->_vptr_TestEventListener[10])(pTVar1,result);
  return;
}

Assistant:

void DefaultGlobalTestPartResultReporter::ReportTestPartResult(
    const TestPartResult& result) {
  unit_test_->current_test_result()->AddTestPartResult(result);
  unit_test_->listeners()->repeater()->OnTestPartResult(result);
}